

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP_Generic.cpp
# Opt level: O0

bool __thiscall SRUP_MSG_GENERIC::Serialize(SRUP_MSG_GENERIC *this,bool preSign)

{
  uint8_t uVar1;
  uint8_t *MSB;
  uint8_t *LSB;
  uint8_t *puVar2;
  int local_40;
  uint8_t byte_1;
  int x_1;
  ushort local_34;
  uint8_t byte;
  int x;
  unsigned_short p;
  unsigned_short header_size;
  uint8_t *lsb;
  uint8_t *msb;
  bool preSign_local;
  SRUP_MSG_GENERIC *this_local;
  
  MSB = (uint8_t *)operator_new__(1);
  LSB = (uint8_t *)operator_new__(1);
  (this->super_SRUP_MSG).m_serial_length = (this->super_SRUP_MSG).m_token_len + 0x14;
  puVar2 = (this->super_SRUP_MSG).m_serialized;
  if (puVar2 != (uint8_t *)0x0) {
    operator_delete__(puVar2);
  }
  if ((this->super_SRUP_MSG).m_sequence_ID == (uint64_t *)0x0) {
    if (MSB != (uint8_t *)0x0) {
      operator_delete__(MSB);
    }
    if (LSB != (uint8_t *)0x0) {
      operator_delete__(LSB);
    }
    this_local._7_1_ = false;
  }
  else if ((this->super_SRUP_MSG).m_sender_ID == (uint64_t *)0x0) {
    if (MSB != (uint8_t *)0x0) {
      operator_delete__(MSB);
    }
    if (LSB != (uint8_t *)0x0) {
      operator_delete__(LSB);
    }
    this_local._7_1_ = false;
  }
  else if ((this->super_SRUP_MSG).m_token == (uint8_t *)0x0) {
    if (MSB != (uint8_t *)0x0) {
      operator_delete__(MSB);
    }
    if (LSB != (uint8_t *)0x0) {
      operator_delete__(LSB);
    }
    this_local._7_1_ = false;
  }
  else {
    puVar2 = (uint8_t *)operator_new__((ulong)(this->super_SRUP_MSG).m_serial_length);
    (this->super_SRUP_MSG).m_serialized = puVar2;
    memset((this->super_SRUP_MSG).m_serialized,0,(ulong)(this->super_SRUP_MSG).m_serial_length);
    *(this->super_SRUP_MSG).m_serialized = *(this->super_SRUP_MSG).m_version;
    (this->super_SRUP_MSG).m_serialized[1] = *(this->super_SRUP_MSG).m_msgtype;
    local_34 = 2;
    for (x_1 = 0; x_1 < 8; x_1 = x_1 + 1) {
      uVar1 = SRUP_MSG::getByteVal(*(this->super_SRUP_MSG).m_sequence_ID,(uint8_t)x_1);
      (this->super_SRUP_MSG).m_serialized[(int)(uint)local_34] = uVar1;
      local_34 = local_34 + 1;
    }
    for (local_40 = 0; local_40 < 8; local_40 = local_40 + 1) {
      uVar1 = SRUP_MSG::getByteVal(*(this->super_SRUP_MSG).m_sender_ID,(uint8_t)local_40);
      (this->super_SRUP_MSG).m_serialized[(int)(uint)local_34] = uVar1;
      local_34 = local_34 + 1;
    }
    SRUP_MSG::encodeLength(LSB,MSB,(this->super_SRUP_MSG).m_token_len);
    (this->super_SRUP_MSG).m_serialized[(int)(uint)local_34] = *MSB;
    (this->super_SRUP_MSG).m_serialized[(int)(uint)(ushort)(local_34 + 1)] = *LSB;
    memcpy((this->super_SRUP_MSG).m_serialized + (int)(uint)(ushort)(local_34 + 2),
           (this->super_SRUP_MSG).m_token,(ulong)(this->super_SRUP_MSG).m_token_len);
    if (MSB != (uint8_t *)0x0) {
      operator_delete__(MSB);
    }
    if (LSB != (uint8_t *)0x0) {
      operator_delete__(LSB);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool SRUP_MSG_GENERIC::Serialize(bool preSign)
{
    uint8_t *msb;
    uint8_t *lsb;

    msb = new uint8_t[1];
    lsb = new uint8_t[1];

    const unsigned short header_size = 18; // 2 + 8 + 8 - to include session ID & sender ID...
    unsigned short p = 0;

    // Serial length is the header + two-byte token length, plus the length of the token in bytes.
    m_serial_length = header_size + 2 + m_token_len;

    delete[] m_serialized;

    // Now check that we have a sequence ID...
    // Technically we don't need one - but we might want use this to check a generic message for a valid sequence ID
    // before we map it onto the correct message type - so we'll include it here.
    if (m_sequence_ID == nullptr)
    {
        delete[] msb;
        delete[] lsb;
        return false;
    }

    // ...by the same logic - we'll also check for the sender ID - as it too, is a part of the "base" message...
    if (m_sender_ID == nullptr)
    {
        delete[] msb;
        delete[] lsb;
        return false;
    }

    // ...and lastly for the token.
    if (m_token == nullptr)
    {
        delete[] msb;
        delete[] lsb;
        return false;
    }

    m_serialized = new unsigned char[m_serial_length];
    std::memset(m_serialized, 0, m_serial_length);

    // The first two fields are fixed length (1 byte each).
    std::memcpy(m_serialized, m_version, 1);
    p+=1;
    std::memcpy(m_serialized + p, m_msgtype, 1);
    p+=1;

    // Now we need to add the Sequence ID
    for (int x=0;x<8;x++)
    {
        uint8_t byte;
        byte = getByteVal(*m_sequence_ID, x);
        std::memcpy(m_serialized + p, &byte, 1);
        p+=1;
    }

    // And the sender ID
    for (int x=0;x<8;x++)
    {
        uint8_t byte;
        byte = getByteVal(*m_sender_ID, x);
        std::memcpy(m_serialized + p, &byte, 1);
        p+=1;
    }

    // And lastly the token...
    encodeLength(lsb, msb, m_token_len);
    std::memcpy(m_serialized + p, msb, 1);
    p+=1;
    std::memcpy(m_serialized + p, lsb, 1);
    p+=1;
    std::memcpy(m_serialized + p, m_token, m_token_len);

    delete[] msb;
    delete[] lsb;

    return true;
}